

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainchan.c
# Opt level: O0

void mainchan_free(Channel *chan)

{
  mainchan *mc;
  Channel *chan_local;
  
  if (chan->vt == &mainchan_channelvt) {
    conf_free((Conf *)chan[-4].vt);
    safefree(&chan[-5].initial_fixed_window_size);
    return;
  }
  __assert_fail("chan->vt == &mainchan_channelvt",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/mainchan.c",
                0x74,"void mainchan_free(Channel *)");
}

Assistant:

static void mainchan_free(Channel *chan)
{
    assert(chan->vt == &mainchan_channelvt);
    mainchan *mc = container_of(chan, mainchan, chan);
    conf_free(mc->conf);
    sfree(mc);
}